

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlReadFile(void)

{
  int iVar1;
  int iVar2;
  char *val;
  char *val_00;
  htmlDocPtr val_01;
  int local_3c;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_filename;
  char *filename;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
    for (n_options = 0; n_options < 4; n_options = n_options + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_filepath(encoding._4_4_,0);
        val_00 = gen_const_char_ptr(n_options,1);
        iVar2 = gen_int(local_3c,2);
        val_01 = (htmlDocPtr)htmlReadFile(val,val_00,iVar2);
        desret_htmlDocPtr(val_01);
        call_tests = call_tests + 1;
        des_filepath(encoding._4_4_,val,0);
        des_const_char_ptr(n_options,val_00,1);
        des_int(local_3c,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)encoding._4_4_);
          printf(" %d",(ulong)(uint)n_options);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlReadFile(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    const char * filename; /* a file or URL */
    int n_filename;
    const char * encoding; /* the document encoding (optional) */
    int n_encoding;
    int options; /* a combination of htmlParserOptions */
    int n_options;

    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        filename = gen_filepath(n_filename, 0);
        encoding = gen_const_char_ptr(n_encoding, 1);
        options = gen_int(n_options, 2);

        ret_val = htmlReadFile(filename, encoding, options);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_filepath(n_filename, filename, 0);
        des_const_char_ptr(n_encoding, encoding, 1);
        des_int(n_options, options, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlReadFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_filename);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}